

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&),_std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&)>
::cni_holder(cni_holder<std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&),_std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&)>
             *this,_func__List_iterator<cs_impl::any>__List_iterator<cs_impl::any>_ptr **func)

{
  function<std::_List_iterator<cs_impl::any>_(std::_List_iterator<cs_impl::any>_&)> *in_RDI;
  cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&),_std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&)>
  *this_00;
  function<std::_List_iterator<cs_impl::any>_(std::_List_iterator<cs_impl::any>_&)>
  *in_stack_ffffffffffffffc0;
  _func__List_iterator<cs_impl::any>__List_iterator<cs_impl::any>_ptr *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_006c6258;
  this_00 = (cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&),_std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<std::_List_iterator<cs_impl::any>(std::_List_iterator<cs_impl::any>&)>::
  function<std::_List_iterator<cs_impl::any>(*const&)(std::_List_iterator<cs_impl::any>&),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&),_std::_List_iterator<cs_impl::any>_(*)(std::_List_iterator<cs_impl::any>_&)>
  ::cni_helper(this_00,in_RDI);
  std::function<std::_List_iterator<cs_impl::any>_(std::_List_iterator<cs_impl::any>_&)>::~function
            ((function<std::_List_iterator<cs_impl::any>_(std::_List_iterator<cs_impl::any>_&)> *)
             0x4b1d56);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}